

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::InitEdge(TEdge *e,TEdge *eNext,TEdge *ePrev,IntPoint *pt,PolyType polyType)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  memset(e,0,0x90);
  e->next = eNext;
  e->prev = ePrev;
  lVar4 = pt->X;
  e->xcurr = lVar4;
  lVar7 = pt->Y;
  e->ycurr = lVar7;
  if (lVar7 < eNext->ycurr) {
    e->xtop = lVar4;
    e->ytop = lVar7;
    lVar1 = eNext->xcurr;
    e->xbot = lVar1;
    lVar5 = eNext->ycurr;
    iVar6 = -1;
    lVar8 = 8;
    lVar2 = lVar4;
    lVar3 = lVar5;
    lVar4 = lVar1;
  }
  else {
    e->xbot = lVar4;
    e->ybot = lVar7;
    lVar2 = eNext->xcurr;
    e->xtop = lVar2;
    lVar5 = eNext->ycurr;
    iVar6 = 1;
    lVar8 = 0x28;
    lVar3 = lVar7;
    lVar7 = lVar5;
  }
  *(long *)((long)&e->xbot + lVar8) = lVar5;
  e->windDelta = iVar6;
  if (lVar7 - lVar3 == 0) {
    dVar9 = -1e+40;
  }
  else {
    dVar9 = (double)(lVar2 - lVar4) / (double)(lVar7 - lVar3);
  }
  e->dx = dVar9;
  e->polyType = polyType;
  e->outIdx = -1;
  return;
}

Assistant:

void InitEdge(TEdge *e, TEdge *eNext,
  TEdge *ePrev, const IntPoint &pt, PolyType polyType)
{
  std::memset( e, 0, sizeof( TEdge ));

  e->next = eNext;
  e->prev = ePrev;
  e->xcurr = pt.X;
  e->ycurr = pt.Y;
  if (e->ycurr >= e->next->ycurr)
  {
    e->xbot = e->xcurr;
    e->ybot = e->ycurr;
    e->xtop = e->next->xcurr;
    e->ytop = e->next->ycurr;
    e->windDelta = 1;
  } else
  {
    e->xtop = e->xcurr;
    e->ytop = e->ycurr;
    e->xbot = e->next->xcurr;
    e->ybot = e->next->ycurr;
    e->windDelta = -1;
  }
  SetDx(*e);
  e->polyType = polyType;
  e->outIdx = -1;
}